

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# drvrmem.c
# Opt level: O0

int mem_write(int hdl,void *buffer,long nbytes)

{
  ulong uVar1;
  char *pcVar2;
  ulong uVar3;
  size_t in_RDX;
  void *in_RSI;
  int in_EDI;
  char *ptr;
  size_t newsize;
  LONGLONG local_38;
  size_t local_30;
  
  if (*memTable[in_EDI].memsizeptr < memTable[in_EDI].currentpos + in_RDX) {
    if (memTable[in_EDI].mem_realloc == (_func_void_ptr_void_ptr_size_t *)0x0) {
      ffpmsg((char *)0x11bdc4);
      return 0x6a;
    }
    uVar1 = ((long)(memTable[in_EDI].currentpos + in_RDX + -1) / 0xb40 + 1) * 0xb40;
    uVar3 = *memTable[in_EDI].memsizeptr + memTable[in_EDI].deltasize;
    if (uVar1 < uVar3 || uVar1 - uVar3 == 0) {
      local_30 = *memTable[in_EDI].memsizeptr + memTable[in_EDI].deltasize;
    }
    else {
      local_30 = ((long)(memTable[in_EDI].currentpos + in_RDX + -1) / 0xb40 + 1) * 0xb40;
    }
    pcVar2 = (char *)(*memTable[in_EDI].mem_realloc)(*memTable[in_EDI].memaddrptr,local_30);
    if (pcVar2 == (char *)0x0) {
      ffpmsg((char *)0x11bf08);
      return 0x71;
    }
    *memTable[in_EDI].memaddrptr = pcVar2;
    *memTable[in_EDI].memsizeptr = local_30;
  }
  memcpy(*memTable[in_EDI].memaddrptr + memTable[in_EDI].currentpos,in_RSI,in_RDX);
  memTable[in_EDI].currentpos = in_RDX + memTable[in_EDI].currentpos;
  if (memTable[in_EDI].currentpos < memTable[in_EDI].fitsfilesize) {
    local_38 = memTable[in_EDI].fitsfilesize;
  }
  else {
    local_38 = memTable[in_EDI].currentpos;
  }
  memTable[in_EDI].fitsfilesize = local_38;
  return 0;
}

Assistant:

int mem_write(int hdl, void *buffer, long nbytes)
/*
  write bytes at the current position in the file
*/
{
    size_t newsize;
    char *ptr;

    if ((size_t) (memTable[hdl].currentpos + nbytes) > 
         *(memTable[hdl].memsizeptr) )
    {
               
        if (!(memTable[hdl].mem_realloc))
        {
            ffpmsg("realloc function not defined (mem_write)");
            return(WRITE_ERROR);
        }

        /*
          Attempt to reallocate additional memory:
          the memory buffer size is incremented by the larger of:
             1 FITS block (2880 bytes) or
             the defined 'deltasize' parameter
         */

        newsize = maxvalue( (size_t)
            (((memTable[hdl].currentpos + nbytes - 1) / 2880) + 1) * 2880,
            *(memTable[hdl].memsizeptr) + memTable[hdl].deltasize);

        /* call the realloc function */
        ptr = (memTable[hdl].mem_realloc)(
                                    *(memTable[hdl].memaddrptr),
                                     newsize);
        if (!ptr)
        {
            ffpmsg("Failed to reallocate memory (mem_write)");
            return(MEMORY_ALLOCATION);
        }

        *(memTable[hdl].memaddrptr) = ptr;
        *(memTable[hdl].memsizeptr) = newsize;
    }

    /* now copy the bytes from the buffer into memory */
    memcpy( *(memTable[hdl].memaddrptr) + memTable[hdl].currentpos,
             buffer,
             nbytes);

    memTable[hdl].currentpos += nbytes;
    memTable[hdl].fitsfilesize =
               maxvalue(memTable[hdl].fitsfilesize,
                        memTable[hdl].currentpos);
    return(0);
}